

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<int_*,_bool> __thiscall
HighsHashTree<int,_int>::InnerLeaf<2>::insert_entry
          (InnerLeaf<2> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  pair<int_*,_bool> pVar11;
  uint16_t hash;
  uint local_1c;
  
  uVar9 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  hash = (uint16_t)uVar9;
  bVar2 = (byte)(uVar9 >> 10);
  uVar7 = (this->occupation).occupation;
  uVar6 = POPCOUNT(uVar7 >> (bVar2 & 0x3f));
  local_1c = (uint)uVar6;
  if ((uVar7 >> (uVar9 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar7 | 1L << (bVar2 & 0x3f);
    iVar4 = this->size;
    if ((int)local_1c < iVar4) {
      puVar10 = (this->hashes)._M_elems + uVar6;
      uVar6 = (ulong)(local_1c - 1);
      do {
        local_1c = (int)uVar6 + 1;
        uVar6 = (ulong)local_1c;
        uVar7 = *puVar10;
        puVar10 = puVar10 + 1;
      } while ((uVar9 & 0xffff) < uVar7);
    }
  }
  else {
    do {
      uVar7 = uVar6 + 1;
      lVar1 = uVar6 - 1;
      uVar6 = uVar7;
    } while ((uVar9 & 0xffff) < (this->hashes)._M_elems[lVar1]);
    local_1c = (int)uVar7 - 2;
    bVar3 = find_key(this,&entry->key_,&hash,(int *)&local_1c);
    uVar6 = (ulong)local_1c;
    if (bVar3) {
      puVar10 = (this->hashes)._M_elems + (long)(int)local_1c + -2;
      uVar8 = 0;
      goto LAB_0028797b;
    }
    iVar4 = this->size;
  }
  uVar5 = (uint)uVar6;
  if ((int)(uint)uVar6 < iVar4) {
    move_backward(this,(int *)&local_1c,&this->size);
    uVar5 = local_1c;
  }
  puVar10 = (this->hashes)._M_elems + (long)(int)uVar5 + -2;
  *(Entry *)(puVar10 + 0x19) = *entry;
  puVar10[2] = (ulong)hash;
  iVar4 = this->size;
  lVar1 = (long)iVar4 + 1;
  this->size = (int)lVar1;
  (this->hashes)._M_elems[(long)iVar4 + 1] = 0;
  uVar8 = CONCAT71((int7)((ulong)lVar1 >> 8),1);
LAB_0028797b:
  pVar11.first = (int *)((long)puVar10 + 0xcc);
  pVar11._8_8_ = uVar8;
  return pVar11;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }